

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::Exp::forward_impl
          (Exp *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  Index index;
  ulong uVar4;
  Index index_1;
  ulong uVar5;
  long lVar6;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  float fVar26;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_70;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  Tensor::operator*(&local_50,
                    *(xs->
                     super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                     _M_impl.super__Vector_impl_data._M_start);
  Tensor::operator*(&local_70,fx);
  if ((local_70.
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value ==
       local_50.
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value) &&
     (local_70.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value ==
      local_50.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value)) {
    uVar3 = local_50.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_cols.m_value *
            local_50.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_rows.m_value;
    uVar4 = uVar3;
    if ((((ulong)local_70.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data & 3) == 0) &&
       (uVar4 = (ulong)(-((uint)((ulong)local_70.
                                        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                        .
                                        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                        .m_data >> 2) & 0x3fffffff) & 0xf),
       (long)uVar3 <= (long)uVar4)) {
      uVar4 = uVar3;
    }
    uVar1 = uVar3 - uVar4;
    uVar5 = uVar1 + 0xf;
    if (-1 < (long)uVar1) {
      uVar5 = uVar1;
    }
    if (0 < (long)uVar4) {
      uVar2 = 0;
      do {
        fVar26 = expf(local_50.
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_data[uVar2]);
        local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data[uVar2] = fVar26;
        uVar2 = uVar2 + 1;
      } while (uVar4 != uVar2);
    }
    lVar6 = (uVar5 & 0xfffffffffffffff0) + uVar4;
    if (0xf < (long)uVar1) {
      auVar7 = vbroadcastss_avx512f(ZEXT416(0x42b0c0a6));
      auVar8 = vbroadcastss_avx512f(ZEXT416(0xc2b0c0a5));
      auVar9 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
      auVar10 = vbroadcastss_avx512f(ZEXT416(0x3fb8aa3b));
      auVar11 = vbroadcastss_avx512f(ZEXT416(0xbf317218));
      auVar12 = vbroadcastss_avx512f(ZEXT416(0x39506967));
      auVar13 = vbroadcastss_avx512f(ZEXT416(0x3ab743ce));
      auVar14 = vbroadcastss_avx512f(ZEXT416(0x3d2aa9c1));
      auVar15 = vbroadcastss_avx512f(ZEXT416(0x3e2aaaaa));
      auVar16 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar17 = vbroadcastss_avx512f(ZEXT416(0x3c088908));
      auVar18 = vbroadcastss_avx512f(ZEXT416(0x42fe0000));
      do {
        auVar19 = vminps_avx512f(*(undefined1 (*) [64])
                                  (local_50.
                                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                   .
                                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                   .m_data + uVar4),auVar7);
        auVar19 = vmaxps_avx512f(auVar19,auVar8);
        auVar20 = vfmadd231ps_avx512f(auVar9,auVar19,auVar10);
        auVar20 = vrndscaleps_avx512f(auVar20,1);
        auVar19 = vfmadd231ps_avx512f(auVar19,auVar20,auVar11);
        auVar21 = vfmadd213ps_avx512f(auVar12,auVar19,auVar13);
        auVar22 = vfmadd213ps_avx512f(auVar14,auVar19,auVar15);
        auVar23 = vmulps_avx512f(auVar19,auVar19);
        auVar24 = vaddps_avx512f(auVar19,auVar16);
        auVar25 = vmulps_avx512f(auVar23,auVar19);
        auVar21 = vfmadd213ps_avx512f(auVar21,auVar19,auVar17);
        auVar19 = vfmadd213ps_avx512f(auVar22,auVar19,auVar9);
        auVar20 = vaddps_avx512f(auVar20,auVar18);
        auVar20 = vcvttps2dq_avx512f(auVar20);
        auVar19 = vfmadd231ps_avx512f(auVar19,auVar25,auVar21);
        auVar20 = vpslld_avx512f(auVar20,0x17);
        auVar19 = vfmadd213ps_avx512f(auVar19,auVar23,auVar24);
        auVar19 = vmulps_avx512f(auVar19,auVar20);
        auVar19 = vmaxps_avx512f(*(undefined1 (*) [64])
                                  (local_50.
                                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                   .
                                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                   .m_data + uVar4),auVar19);
        *(undefined1 (*) [64])
         (local_70.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data + uVar4) = auVar19;
        uVar4 = uVar4 + 0x10;
      } while ((long)uVar4 < lVar6);
    }
    if (lVar6 < (long)uVar3) {
      do {
        fVar26 = expf(local_50.
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_data[lVar6]);
        local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data[lVar6] = fVar26;
        lVar6 = lVar6 + 1;
      } while (uVar3 - lVar6 != 0);
    }
    return;
  }
  __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, -1, -1>>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, -1>>]"
               );
}

Assistant:

void Exp::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("Exp not yet implemented for CUDA");
#else
  auto x = **xs[0];
  *fx = x.array().exp();
#endif
}